

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper_template.h
# Opt level: O0

int compute_all_mulw(uint16_t dst,target_long src1)

{
  byte bVar1;
  target_long tVar2;
  int of;
  int sf;
  int zf;
  int af;
  int pf;
  int cf;
  target_long src1_local;
  uint16_t dst_local;
  
  bVar1 = "\x04"[(byte)dst];
  tVar2 = lshift((ulong)dst,-8);
  return (uint)(src1 != 0 | bVar1) | (uint)(dst == 0) << 6 | (uint)tVar2 & 0x80 |
         (uint)(src1 != 0) << 0xb;
}

Assistant:

static int glue(compute_all_mul, SUFFIX)(DATA_TYPE dst, target_long src1)
{
    int cf, pf, af, zf, sf, of;

    cf = (src1 != 0);
    pf = parity_table[(uint8_t)dst];
    af = 0; /* undefined */
    zf = (dst == 0) * CC_Z;
    sf = lshift(dst, 8 - DATA_BITS) & CC_S;
    of = cf * CC_O;
    return cf | pf | af | zf | sf | of;
}